

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  RecGroupStore *pRVar5;
  HeapType HVar6;
  Field *pFVar7;
  undefined8 *puVar8;
  _Hash_node_base *p_Var9;
  undefined8 uVar10;
  bool bVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  undefined8 *puVar16;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var17;
  undefined8 *puVar18;
  ulong uVar19;
  size_type __n;
  ulong uVar20;
  undefined8 *puVar21;
  _Hash_node_base *p_Var22;
  long lVar23;
  pointer __ptr_1;
  long lVar24;
  const_iterator __begin2;
  ulong uVar25;
  Field *pFVar26;
  Field *b;
  const_iterator __end2;
  bool bVar27;
  undefined1 auVar28 [16];
  RecGroupStore *local_58;
  ulong local_50;
  undefined1 local_48 [8];
  __buckets_alloc_type __alloc;
  long local_38;
  
  lVar24 = 1;
  uVar25 = 1;
  if (((ulong)this & 1) == 0) {
    uVar25 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  if (((ulong)this & 1) == 0) {
    lVar24 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align >> 3;
  }
  local_48 = (undefined1  [8])this;
  if (lVar24 != 0) {
    lVar23 = 0;
    local_50 = 0x9e3779b97f4a8c16;
    local_38 = -0x61c8864680b583ea;
    do {
      uVar19 = (ulong)this & 0xfffffffffffffffe;
      if (((ulong)this & 1) == 0) {
        uVar19 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar23 * 8);
      }
      if (uVar19 < 0x7d) {
        uVar12 = uVar19 + 0x9e3779b97f4a8c15;
      }
      else {
        HVar6.id = *(uintptr_t *)(uVar19 + 8);
        uVar12 = 0x9e3779b97f4a7c15;
        if (HVar6.id != 0) {
          uVar12 = local_50;
        }
        uVar20 = HVar6.id != 0 ^ uVar12;
        if (HVar6.id != 0) {
          sVar13 = RecGroupHasher::hash((RecGroupHasher *)local_48,HVar6);
          uVar20 = uVar20 ^ (uVar12 >> 4) + 0x9e3779b97f4a7c15 + uVar20 * 0x1000 + sVar13;
        }
        HVar6.id = *(uintptr_t *)(uVar19 + 0x10);
        lVar14 = local_38;
        if (HVar6.id == 0) {
          lVar14 = -0x61c8864680b583eb;
        }
        uVar20 = (uVar20 >> 4) + uVar20 * 0x1000 + lVar14 ^ uVar20;
        if (HVar6.id != 0) {
          sVar13 = RecGroupHasher::hash((RecGroupHasher *)local_48,HVar6);
          uVar20 = uVar20 ^ (uVar20 >> 4) + sVar13 + uVar20 * 0x1000 + -0x61c8864680b583eb;
        }
        HVar6.id = *(uintptr_t *)(uVar19 + 0x18);
        lVar14 = local_38;
        if (HVar6.id == 0) {
          lVar14 = -0x61c8864680b583eb;
        }
        uVar20 = (uVar20 >> 4) + uVar20 * 0x1000 + lVar14 ^ uVar20;
        if (HVar6.id != 0) {
          sVar13 = RecGroupHasher::hash((RecGroupHasher *)local_48,HVar6);
          uVar20 = uVar20 ^ (uVar20 >> 4) + sVar13 + uVar20 * 0x1000 + -0x61c8864680b583eb;
        }
        iVar3 = *(int *)(uVar19 + 0x30);
        if (3 < iVar3 - 1U) {
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                             ,0x7fc);
        }
        bVar2 = *(byte *)(uVar19 + 1);
        uVar4 = *(uint *)(uVar19 + 4);
        switch(iVar3) {
        case 1:
          sVar13 = RecGroupHasher::hash
                             ((RecGroupHasher *)local_48,(Type)*(uintptr_t *)(uVar19 + 0x38));
          sVar15 = RecGroupHasher::hash
                             ((RecGroupHasher *)local_48,(Type)*(uintptr_t *)(uVar19 + 0x40));
          uVar12 = (sVar13 >> 4) + sVar15 + sVar13 * 0x1000 + -0x61c8864680b583eb ^ sVar13;
          break;
        case 2:
          pFVar26 = *(Field **)(uVar19 + 0x38);
          pFVar7 = *(Field **)(uVar19 + 0x40);
          uVar12 = (long)pFVar7 - (long)pFVar26 >> 4;
          for (; pFVar7 != pFVar26; pFVar26 = pFVar26 + 1) {
            sVar13 = RecGroupHasher::hash((RecGroupHasher *)local_48,pFVar26);
            uVar12 = uVar12 ^ uVar12 * 0x1000 + -0x61c8864680b583eb + (uVar12 >> 4) + sVar13;
          }
          break;
        case 3:
          uVar12 = RecGroupHasher::hash((RecGroupHasher *)local_48,(Field *)(uVar19 + 0x38));
          break;
        case 4:
          sVar13 = RecGroupHasher::hash
                             ((RecGroupHasher *)local_48,(HeapType)*(uintptr_t *)(uVar19 + 0x38));
          uVar12 = (sVar13 >> 4) + sVar13 * 0x1000 + 0x9e3779b97f567d2c ^ sVar13;
        }
        uVar20 = uVar20 * 0x1000 + -0x61c8864680b583eb + (uVar20 >> 4) + (ulong)bVar2 ^ uVar20;
        uVar20 = (uVar20 >> 4) + uVar20 * 0x1000 + (ulong)uVar4 + 0x9e3779b97f4a7c15 ^ uVar20;
        uVar20 = (uVar20 >> 4) + uVar20 * 0x1000 + (long)iVar3 + -0x61c8864680b583eb ^ uVar20;
        uVar12 = (uVar20 * 0x1000 + -0x61c8864680b583eb + (uVar20 >> 4) + uVar12 ^ uVar20) +
                 0x9e3779b97f4a7c15;
      }
      uVar25 = uVar25 ^ uVar25 * 0x1000 + -0x61c8864680b583eb + (uVar25 >> 4) +
                        (uVar19 < 0x7d ^ uVar12);
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar24);
  }
  uVar19 = uVar25 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  puVar16 = *(undefined8 **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar19 * 8);
  puVar18 = (undefined8 *)0x0;
  if (puVar16 != (undefined8 *)0x0) {
    puVar21 = (undefined8 *)*puVar16;
    do {
      if (puVar21[2] == uVar25) {
        pRVar5 = (RecGroupStore *)puVar21[1];
        puVar18 = puVar16;
        local_48 = (undefined1  [8])this;
        ___alloc = (uintptr_t)pRVar5;
        if (pRVar5 == this) break;
        lVar24 = 1;
        lVar23 = 1;
        if (((ulong)this & 1) == 0) {
          lVar23 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
                   (this->mutex).super___mutex_base._M_mutex.__align >> 3;
        }
        if (((ulong)pRVar5 & 1) == 0) {
          lVar24 = *(long *)((long)&(pRVar5->mutex).super___mutex_base._M_mutex + 8) -
                   (pRVar5->mutex).super___mutex_base._M_mutex.__align >> 3;
        }
        if (lVar23 == lVar24) {
          bVar27 = lVar23 == 0;
          if (!bVar27) {
            bVar27 = false;
            lVar24 = 0;
            do {
              uVar12 = (ulong)this & 0xfffffffffffffffe;
              if (((ulong)this & 1) == 0) {
                uVar12 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar24 * 8);
              }
              uVar20 = (ulong)pRVar5 & 0xfffffffffffffffe;
              if (((ulong)pRVar5 & 1) == 0) {
                uVar20 = *(ulong *)((pRVar5->mutex).super___mutex_base._M_mutex.__align + lVar24 * 8
                                   );
              }
              if (uVar12 != uVar20) {
                if ((uVar12 < 0x7d) || (uVar20 < 0x7d)) break;
                HVar6.id = *(uintptr_t *)(uVar12 + 8);
                if (((HVar6.id != 0) == (*(uintptr_t *)(uVar20 + 8) == 0)) ||
                   ((HVar6.id != 0 &&
                    (bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,HVar6,
                                                  (HeapType)*(uintptr_t *)(uVar20 + 8)), !bVar11))))
                break;
                HVar6.id = *(uintptr_t *)(uVar12 + 0x10);
                if (((HVar6.id != 0) == (*(uintptr_t *)(uVar20 + 0x10) == 0)) ||
                   ((HVar6.id != 0 &&
                    (bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,HVar6,
                                                  (HeapType)*(uintptr_t *)(uVar20 + 0x10)), !bVar11)
                    ))) break;
                HVar6.id = *(uintptr_t *)(uVar12 + 0x18);
                if ((((HVar6.id != 0) == (*(uintptr_t *)(uVar20 + 0x18) == 0)) ||
                    (((HVar6.id != 0 &&
                      (bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,HVar6,
                                                    (HeapType)*(uintptr_t *)(uVar20 + 0x18)),
                      !bVar11)) || (*(char *)(uVar12 + 1) != *(char *)(uVar20 + 1))))) ||
                   ((*(int *)(uVar12 + 4) != *(int *)(uVar20 + 4) ||
                    (*(int *)(uVar12 + 0x30) != *(int *)(uVar20 + 0x30))))) break;
                switch(*(int *)(uVar12 + 0x30)) {
                case 1:
                  bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,
                                               (Type)*(uintptr_t *)(uVar12 + 0x38),
                                               (Type)*(uintptr_t *)(uVar20 + 0x38));
                  if (!bVar11) goto LAB_00cc6891;
                  bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,
                                               (Type)*(uintptr_t *)(uVar12 + 0x40),
                                               (Type)*(uintptr_t *)(uVar20 + 0x40));
                  break;
                case 2:
                  pFVar26 = *(Field **)(uVar12 + 0x38);
                  pFVar7 = *(Field **)(uVar12 + 0x40);
                  b = *(Field **)(uVar20 + 0x38);
                  if ((long)pFVar7 - (long)pFVar26 != *(long *)(uVar20 + 0x40) - (long)b)
                  goto LAB_00cc6891;
                  bVar11 = pFVar26 == pFVar7;
                  if (!bVar11) {
                    bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,pFVar26,b);
                    while( true ) {
                      if (!bVar11) goto LAB_00cc6891;
                      pFVar26 = pFVar26 + 1;
                      b = b + 1;
                      bVar11 = pFVar26 == pFVar7;
                      if (bVar11) break;
                      bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,pFVar26,b);
                    }
                  }
                  break;
                case 3:
                  bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,(Field *)(uVar12 + 0x38),
                                               (Field *)(uVar20 + 0x38));
                  break;
                case 4:
                  bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_48,
                                               (HeapType)*(uintptr_t *)(uVar12 + 0x38),
                                               (HeapType)*(uintptr_t *)(uVar20 + 0x38));
                  break;
                default:
                  handle_unreachable("unexpected kind",
                                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                                     ,0x895);
                }
                if (bVar11 == false) break;
              }
              lVar24 = lVar24 + 1;
              bVar27 = lVar24 == lVar23;
            } while (!bVar27);
          }
LAB_00cc6891:
          if (bVar27) break;
        }
      }
      puVar8 = (undefined8 *)*puVar21;
      if (puVar8 == (undefined8 *)0x0) {
        puVar18 = (undefined8 *)0x0;
        break;
      }
      puVar18 = (undefined8 *)0x0;
      puVar16 = puVar21;
      puVar21 = puVar8;
    } while ((ulong)puVar8[2] % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ ==
             uVar19);
  }
  if (puVar18 == (undefined8 *)0x0) {
    puVar18 = (undefined8 *)0x0;
  }
  else {
    puVar18 = (undefined8 *)*puVar18;
  }
  puVar16 = puVar18;
  if (puVar18 == (undefined8 *)0x0) {
    puVar16 = (undefined8 *)operator_new(0x18);
    *puVar16 = 0;
    puVar16[1] = this;
    auVar28 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        (0x10d29e8,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                         wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
    __n = auVar28._8_8_;
    if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
        __s = (_Hash_node_base **)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)local_48,__n,(void *)0x0
                        );
        memset(__s,0,__n * 8);
      }
      p_Var22 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
      if (p_Var22 != (_Hash_node_base *)0x0) {
        uVar19 = 0;
        do {
          p_Var9 = p_Var22->_M_nxt;
          uVar12 = (ulong)p_Var22[2]._M_nxt % __n;
          if (__s[uVar12] == (_Hash_node_base *)0x0) {
            p_Var22->_M_nxt =
                 (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
            wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var22;
            __s[uVar12] = (_Hash_node_base *)
                          (wasm::(anonymous_namespace)::globalRecGroupStore + 0x38);
            if (p_Var22->_M_nxt != (_Hash_node_base *)0x0) {
              p_Var17 = (_Hash_node_base *)(__s + uVar19);
              goto LAB_00cc69ce;
            }
          }
          else {
            p_Var22->_M_nxt = __s[uVar12]->_M_nxt;
            p_Var17 = __s[uVar12];
            uVar12 = uVar19;
LAB_00cc69ce:
            p_Var17->_M_nxt = p_Var22;
          }
          p_Var22 = p_Var9;
          uVar19 = uVar12;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      if (wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ != 0x10d29f8) {
        operator_delete((void *)wasm::(anonymous_namespace)::globalRecGroupStore._40_8_,
                        wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ << 3);
      }
      uVar19 = uVar25 % __n;
      wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
      wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
    }
    puVar16[2] = uVar25;
    uVar10 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
    puVar21 = *(undefined8 **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar19 * 8)
    ;
    if (puVar21 == (undefined8 *)0x0) {
      *puVar16 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      puVar21 = puVar16;
      if (wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ != 0) {
        puVar1 = (ulong *)(wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ + 0x10);
        wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar16;
        *(undefined8 **)
         (uVar10 + (*puVar1 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) =
             puVar16;
        puVar21 = (undefined8 *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
      }
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar21;
      *(undefined8 *)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar19 * 8) =
           0x10d29d8;
    }
    else {
      *puVar16 = *puVar21;
      **(undefined8 **)(uVar10 + uVar19 * 8) = puVar16;
    }
    wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
         wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  }
  local_58 = this;
  if (puVar18 != (undefined8 *)0x0) {
    local_58 = (RecGroupStore *)puVar16[1];
  }
  return (RecGroup)(uintptr_t)local_58;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }